

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O1

int32_t createTagStringWithAlternates
                  (char *lang,int32_t langLength,char *script,int32_t scriptLength,char *region,
                  int32_t regionLength,char *trailing,int32_t trailingLength,char *alternateTags,
                  char *tag,int32_t tagCapacity,UErrorCode *err)

{
  UErrorCode UVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  char alternateRegion [4];
  char local_e4 [12];
  undefined2 local_d8;
  undefined1 local_d6;
  
  if ((((U_ZERO_ERROR < *err) || (3 < regionLength)) || (5 < scriptLength)) ||
     ((0xb < langLength || (tag == (char *)0x0)))) goto LAB_00288321;
  if (langLength < 1) {
    if (alternateTags == (char *)0x0) {
      local_d6 = 100;
      local_d8 = 0x6e75;
      langLength = 3;
      goto LAB_002883a2;
    }
    uVar5 = uloc_getLanguage_63(alternateTags,local_e4,0xc,err);
    UVar1 = *err;
    bVar2 = (int)uVar5 < 0xc;
    langLength = 0;
    if (bVar2 && UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (uVar5 == 0) {
        local_d6 = 100;
        local_d8 = 0x6e75;
        langLength = 3;
      }
      else {
        pvVar7 = memcpy(&local_d8,local_e4,(long)(int)uVar5);
        langLength = uVar5;
        uVar5 = (uint)pvVar7;
      }
    }
    if (bVar2 && UVar1 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002883a2;
LAB_00288689:
    bVar2 = false;
  }
  else {
    memcpy(&local_d8,lang,(ulong)(uint)langLength);
LAB_002883a2:
    if (scriptLength < 1) {
      if (alternateTags != (char *)0x0) {
        uVar6 = uloc_getScript_63(alternateTags,local_e4,6,err);
        bVar3 = *err < U_ILLEGAL_ARGUMENT_ERROR;
        bVar2 = (int)uVar6 < 6;
        uVar5 = CONCAT31((int3)(uVar6 >> 8),0 < (int)uVar6 && (bVar2 && bVar3));
        if (0 < (int)uVar6 && (bVar2 && bVar3)) {
          if (0 < langLength) {
            *(undefined1 *)((long)&local_d8 + (ulong)(uint)langLength) = 0x5f;
            langLength = langLength + 1;
          }
          pvVar7 = memcpy((void *)((long)&local_d8 + (long)langLength),local_e4,(ulong)uVar6);
          uVar5 = (uint)pvVar7;
          langLength = langLength + uVar6;
        }
        if (!bVar2 || !bVar3) goto LAB_00288689;
      }
    }
    else {
      if (0 < langLength) {
        *(undefined1 *)((long)&local_d8 + (ulong)(uint)langLength) = 0x5f;
        langLength = langLength + 1;
      }
      memcpy((void *)((long)&local_d8 + (long)langLength),script,(ulong)(uint)scriptLength);
      langLength = langLength + scriptLength;
    }
    if (regionLength < 1) {
      if (alternateTags == (char *)0x0) {
        bVar2 = false;
      }
      else {
        uVar6 = uloc_getCountry_63(alternateTags,local_e4,4,err);
        bVar4 = *err < U_ILLEGAL_ARGUMENT_ERROR;
        bVar3 = (int)uVar6 < 4;
        uVar5 = CONCAT31((int3)(uVar6 >> 8),0 < (int)uVar6 && (bVar3 && bVar4));
        if (0 < (int)uVar6 && (bVar3 && bVar4)) {
          if (0 < langLength) {
            *(undefined1 *)((long)&local_d8 + (ulong)(uint)langLength) = 0x5f;
            langLength = langLength + 1;
          }
          pvVar7 = memcpy((void *)((long)&local_d8 + (long)langLength),local_e4,(ulong)uVar6);
          uVar5 = (uint)pvVar7;
          langLength = langLength + uVar6;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if (!bVar3 || !bVar4) goto LAB_00288689;
      }
    }
    else {
      if (0 < langLength) {
        *(undefined1 *)((long)&local_d8 + (ulong)(uint)langLength) = 0x5f;
        langLength = langLength + 1;
      }
      memcpy((void *)((long)&local_d8 + (long)langLength),region,(ulong)(uint)regionLength);
      langLength = langLength + regionLength;
      bVar2 = true;
    }
    uVar5 = tagCapacity;
    if (langLength < tagCapacity) {
      uVar5 = langLength;
    }
    memcpy(tag,&local_d8,(long)(int)uVar5);
    if (0 < trailingLength) {
      uVar5 = tagCapacity - uVar5;
      if ((*trailing == '@') || ((int)uVar5 < 1)) {
        uVar8 = (ulong)(uint)langLength;
        uVar6 = uVar5;
      }
      else {
        tag[langLength] = '_';
        uVar8 = (long)langLength + 1;
        uVar6 = uVar5 - 1;
        if ((!bVar2) && (1 < (int)uVar5)) {
          tag[uVar8] = '_';
          uVar8 = (ulong)(langLength + 2);
          uVar6 = uVar5 - 2;
        }
      }
      langLength = (int32_t)uVar8;
      if (0 < (int)uVar6) {
        if (trailingLength <= (int)uVar6) {
          uVar6 = trailingLength;
        }
        memmove(tag + langLength,trailing,(ulong)uVar6);
      }
    }
    uVar5 = u_terminateChars_63(tag,tagCapacity,langLength + trailingLength,err);
    bVar2 = true;
  }
  if (bVar2) {
    return uVar5;
  }
LAB_00288321:
  if (*err == U_BUFFER_OVERFLOW_ERROR || *err < U_ILLEGAL_ARGUMENT_ERROR) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return -1;
}

Assistant:

static int32_t U_CALLCONV
createTagStringWithAlternates(
    const char* lang,
    int32_t langLength,
    const char* script,
    int32_t scriptLength,
    const char* region,
    int32_t regionLength,
    const char* trailing,
    int32_t trailingLength,
    const char* alternateTags,
    char* tag,
    int32_t tagCapacity,
    UErrorCode* err) {

    if (U_FAILURE(*err)) {
        goto error;
    }
    else if (tag == NULL ||
             tagCapacity <= 0 ||
             langLength >= ULOC_LANG_CAPACITY ||
             scriptLength >= ULOC_SCRIPT_CAPACITY ||
             regionLength >= ULOC_COUNTRY_CAPACITY) {
        goto error;
    }
    else {
        /**
         * ULOC_FULLNAME_CAPACITY will provide enough capacity
         * that we can build a string that contains the language,
         * script and region code without worrying about overrunning
         * the user-supplied buffer.
         **/
        char tagBuffer[ULOC_FULLNAME_CAPACITY];
        int32_t tagLength = 0;
        int32_t capacityRemaining = tagCapacity;
        UBool regionAppended = FALSE;

        if (langLength > 0) {
            appendTag(
                lang,
                langLength,
                tagBuffer,
                &tagLength);
        }
        else if (alternateTags == NULL) {
            /*
             * Append the value for an unknown language, if
             * we found no language.
             */
            appendTag(
                unknownLanguage,
                (int32_t)uprv_strlen(unknownLanguage),
                tagBuffer,
                &tagLength);
        }
        else {
            /*
             * Parse the alternateTags string for the language.
             */
            char alternateLang[ULOC_LANG_CAPACITY];
            int32_t alternateLangLength = sizeof(alternateLang);

            alternateLangLength =
                uloc_getLanguage(
                    alternateTags,
                    alternateLang,
                    alternateLangLength,
                    err);
            if(U_FAILURE(*err) ||
                alternateLangLength >= ULOC_LANG_CAPACITY) {
                goto error;
            }
            else if (alternateLangLength == 0) {
                /*
                 * Append the value for an unknown language, if
                 * we found no language.
                 */
                appendTag(
                    unknownLanguage,
                    (int32_t)uprv_strlen(unknownLanguage),
                    tagBuffer,
                    &tagLength);
            }
            else {
                appendTag(
                    alternateLang,
                    alternateLangLength,
                    tagBuffer,
                    &tagLength);
            }
        }

        if (scriptLength > 0) {
            appendTag(
                script,
                scriptLength,
                tagBuffer,
                &tagLength);
        }
        else if (alternateTags != NULL) {
            /*
             * Parse the alternateTags string for the script.
             */
            char alternateScript[ULOC_SCRIPT_CAPACITY];

            const int32_t alternateScriptLength =
                uloc_getScript(
                    alternateTags,
                    alternateScript,
                    sizeof(alternateScript),
                    err);

            if (U_FAILURE(*err) ||
                alternateScriptLength >= ULOC_SCRIPT_CAPACITY) {
                goto error;
            }
            else if (alternateScriptLength > 0) {
                appendTag(
                    alternateScript,
                    alternateScriptLength,
                    tagBuffer,
                    &tagLength);
            }
        }

        if (regionLength > 0) {
            appendTag(
                region,
                regionLength,
                tagBuffer,
                &tagLength);

            regionAppended = TRUE;
        }
        else if (alternateTags != NULL) {
            /*
             * Parse the alternateTags string for the region.
             */
            char alternateRegion[ULOC_COUNTRY_CAPACITY];

            const int32_t alternateRegionLength =
                uloc_getCountry(
                    alternateTags,
                    alternateRegion,
                    sizeof(alternateRegion),
                    err);
            if (U_FAILURE(*err) ||
                alternateRegionLength >= ULOC_COUNTRY_CAPACITY) {
                goto error;
            }
            else if (alternateRegionLength > 0) {
                appendTag(
                    alternateRegion,
                    alternateRegionLength,
                    tagBuffer,
                    &tagLength);

                regionAppended = TRUE;
            }
        }

        {
            const int32_t toCopy =
                tagLength >= tagCapacity ? tagCapacity : tagLength;

            /**
             * Copy the partial tag from our internal buffer to the supplied
             * target.
             **/
            uprv_memcpy(
                tag,
                tagBuffer,
                toCopy);

            capacityRemaining -= toCopy;
        }

        if (trailingLength > 0) {
            if (*trailing != '@' && capacityRemaining > 0) {
                tag[tagLength++] = '_';
                --capacityRemaining;
                if (capacityRemaining > 0 && !regionAppended) {
                    /* extra separator is required */
                    tag[tagLength++] = '_';
                    --capacityRemaining;
                }
            }

            if (capacityRemaining > 0) {
                /*
                 * Copy the trailing data into the supplied buffer.  Use uprv_memmove, since we
                 * don't know if the user-supplied buffers overlap.
                 */
                const int32_t toCopy =
                    trailingLength >= capacityRemaining ? capacityRemaining : trailingLength;

                uprv_memmove(
                    &tag[tagLength],
                    trailing,
                    toCopy);
            }
        }

        tagLength += trailingLength;

        return u_terminateChars(
                    tag,
                    tagCapacity,
                    tagLength,
                    err);
    }

error:

    /**
     * An overflow indicates the locale ID passed in
     * is ill-formed.  If we got here, and there was
     * no previous error, it's an implicit overflow.
     **/
    if (*err ==  U_BUFFER_OVERFLOW_ERROR ||
        U_SUCCESS(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    return -1;
}